

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

int __thiscall itis::AVLTree<long>::find(AVLTree<long> *this,long value)

{
  bool bVar1;
  int local_3c;
  int local_34;
  int local_2c;
  AVLTreeNode<long> *pAStack_28;
  int idx;
  AVLTreeNode<long> *direct;
  long value_local;
  AVLTree<long> *this_local;
  
  pAStack_28 = this->root;
  local_2c = 0;
  while( true ) {
    bVar1 = false;
    if (pAStack_28 != (AVLTreeNode<long> *)0x0) {
      bVar1 = pAStack_28->value != value;
    }
    if (!bVar1) break;
    if (value < pAStack_28->value) {
      pAStack_28 = pAStack_28->left;
    }
    else {
      if (pAStack_28->left == (AVLTreeNode<long> *)0x0) {
        local_34 = 0;
      }
      else {
        local_34 = pAStack_28->left->count;
      }
      local_2c = local_34 + 1 + local_2c;
      pAStack_28 = pAStack_28->right;
    }
  }
  if (pAStack_28 == (AVLTreeNode<long> *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    if (pAStack_28->left == (AVLTreeNode<long> *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = pAStack_28->left->count;
    }
    this_local._4_4_ = local_2c + local_3c;
  }
  return this_local._4_4_;
}

Assistant:

int AVLTree<T>::find(T value) const {
    AVLTreeNode<T> *direct = root;
    int idx = 0;

    while (direct != nullptr and direct->value != value) {
      if (direct->value > value) {
        direct = direct->left;
      } else {
        idx += (direct->left ? direct->left->count : 0) + 1;
        direct = direct->right;
      }
    }

    if (direct == nullptr) {
      return -1;
    }
    return idx + (direct->left ? direct->left->count : 0);
  }